

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  long lVar1;
  int *piVar2;
  Allocator *pAVar3;
  pointer pBVar4;
  FILE *__stream;
  Layer *pLVar5;
  uint uVar6;
  int iVar7;
  reference pvVar8;
  undefined8 uVar9;
  reference pvVar10;
  Mat *pMVar11;
  ulong uVar12;
  NetPrivate *pNVar13;
  reference ppLVar14;
  long *in_RSI;
  long *in_RDI;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_3;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  char blob_name [256];
  Blob *blob_2;
  int j_1;
  Blob *blob;
  Blob *blob_1;
  int bottom_blob_index;
  char bottom_name [256];
  int j;
  Layer *layer;
  int top_count;
  int bottom_count;
  char layer_name [256];
  char layer_type [256];
  int i;
  int blob_index;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  char *in_stack_fffffffffffff478;
  Mat *in_stack_fffffffffffff480;
  FILE *in_stack_fffffffffffff490;
  uint in_stack_fffffffffffff498;
  int in_stack_fffffffffffff49c;
  NetPrivate *in_stack_fffffffffffff4a0;
  NetPrivate *in_stack_fffffffffffff4b0;
  NetPrivate *in_stack_fffffffffffff4b8;
  NetPrivate *in_stack_fffffffffffff4c0;
  NetPrivate *in_stack_fffffffffffff4d0;
  DataReader *in_stack_fffffffffffff4e0;
  ParamDict *in_stack_fffffffffffff4e8;
  Net *in_stack_fffffffffffff510;
  int local_9e0;
  int local_9dc;
  ParamDict local_9d8;
  undefined8 local_9c8;
  undefined4 local_9c0;
  long *local_9b8;
  undefined4 local_9b0;
  int local_9ac;
  int local_9a8;
  undefined4 local_9a4;
  int local_9a0;
  ulong local_998;
  undefined1 local_990 [8];
  int *local_988;
  Allocator *local_980;
  undefined4 local_978;
  long *local_970;
  undefined4 local_968;
  int local_964;
  int local_960;
  undefined4 local_95c;
  int local_958;
  long local_950;
  NetPrivate *local_948;
  int *local_940;
  undefined8 local_938;
  undefined4 local_930;
  long *local_928;
  undefined4 local_920;
  int local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  long local_908;
  int local_8fc;
  reference local_8f8;
  int local_8ec;
  int *local_8e8;
  Mat local_8e0;
  Mat local_898;
  int local_850;
  allocator<char> local_849;
  string local_848 [32];
  undefined1 local_828 [256];
  reference local_728;
  int local_71c;
  reference local_718;
  allocator<char> local_709;
  string local_708 [32];
  reference local_6e8;
  int local_6dc;
  undefined1 local_6d8 [256];
  int local_5d8;
  allocator<char> local_5d1;
  string local_5d0 [39];
  allocator<char> local_5a9;
  string local_5a8 [32];
  Layer *local_588;
  undefined4 local_580;
  int local_570;
  int local_56c;
  undefined1 local_568 [256];
  undefined1 local_468 [264];
  uint local_360;
  int local_35c;
  ParamDict local_358;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_324;
  Mat *local_320;
  int local_318;
  undefined4 local_314;
  NetPrivate *local_310;
  NetPrivate *local_308;
  NetPrivate *local_300;
  int local_2f8;
  undefined4 local_2f4;
  NetPrivate *local_2f0;
  NetPrivate *local_2e8;
  NetPrivate *local_2e0;
  ParamDict *local_2d0;
  Mat *local_2c8;
  Mat *local_2c0;
  undefined8 *local_2b0;
  Mat *local_2a8;
  Mat *local_2a0;
  NetPrivate **local_290;
  Mat *local_288;
  Mat *local_280;
  Mat *local_278;
  NetPrivate **local_268;
  Net *local_258;
  ParamDict *local_248;
  Mat *local_238;
  int local_218;
  undefined4 local_214;
  Mat *local_210;
  int local_1f8;
  undefined4 local_1f4;
  ParamDict *local_1f0;
  int local_1d8;
  undefined4 local_1d4;
  Net *local_1d0;
  int local_1b8;
  undefined4 local_1b4;
  NetPrivate **local_1b0;
  int local_198;
  undefined4 local_194;
  Mat *local_190;
  int local_188;
  undefined4 local_184;
  Mat *local_180;
  int local_178;
  undefined4 local_174;
  Mat *local_170;
  int local_168;
  undefined4 local_164;
  Mat *local_160;
  int local_158;
  undefined4 local_154;
  NetPrivate *local_150;
  int local_148;
  undefined4 local_144;
  NetPrivate *local_140;
  Mat *local_138;
  Mat *local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 local_110;
  int local_104;
  NetPrivate **local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d8;
  int local_d4;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  ParamDict *local_98;
  Option *local_90;
  Option *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  NetPrivate *local_58;
  _func_int **local_48;
  _func_int **local_38;
  Mat *local_18;
  undefined4 local_c;
  long local_8;
  
  local_33c = 0;
  local_338 = in_RSI;
  iVar7 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%d",&local_33c);
  if (iVar7 == 1) {
    if (local_33c == 0x7685dd) {
      local_340 = 0;
      local_344 = 0;
      iVar7 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_340);
      if (iVar7 == 1) {
        iVar7 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_344);
        if (iVar7 == 1) {
          if ((local_340 < 1) || (local_344 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count");
            fprintf(_stderr,"\n");
            local_324 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       in_stack_fffffffffffff4a0,
                       CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_fffffffffffff4a0,
                       CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
            ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff4a0);
            local_35c = 0;
            for (local_360 = 0; (int)local_360 < local_340; local_360 = local_360 + 1) {
              local_56c = 0;
              local_570 = 0;
              iVar7 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_468);
              if (iVar7 != 1) {
                fprintf(_stderr,"parse layer_type failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_001f3e63;
              }
              iVar7 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_568);
              if (iVar7 != 1) {
                fprintf(_stderr,"parse layer_name failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_001f3e63;
              }
              iVar7 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_56c);
              if (iVar7 != 1) {
                fprintf(_stderr,"parse bottom_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_001f3e63;
              }
              iVar7 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_570);
              if (iVar7 != 1) {
                fprintf(_stderr,"parse top_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_001f3e63;
              }
              local_588 = create_layer(in_stack_fffffffffffff478);
              if (local_588 == (Layer *)0x0) {
                local_588 = (Layer *)(**(code **)(*in_RDI + 0x18))(in_RDI,local_468);
              }
              if (local_588 == (Layer *)0x0) {
                fprintf(_stderr,"layer %s not exists or registered",local_468);
                fprintf(_stderr,"\n");
                clear(in_stack_fffffffffffff510);
                local_324 = -1;
                goto LAB_001f3e63;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8,
                         (allocator<char> *)in_stack_fffffffffffff4b0);
              std::__cxx11::string::operator=((string *)&local_588->type,local_5a8);
              std::__cxx11::string::~string(local_5a8);
              std::allocator<char>::~allocator(&local_5a9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8,
                         (allocator<char> *)in_stack_fffffffffffff4b0);
              std::__cxx11::string::operator=((string *)&local_588->name,local_5d0);
              std::__cxx11::string::~string(local_5d0);
              std::allocator<char>::~allocator(&local_5d1);
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff4a0,
                         CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
              for (local_5d8 = 0; local_5d8 < local_56c; local_5d8 = local_5d8 + 1) {
                iVar7 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_6d8);
                if (iVar7 != 1) {
                  fprintf(_stderr,"parse bottom_name failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  goto LAB_001f3e63;
                }
                local_6dc = find_blob_index_by_name
                                      ((Net *)CONCAT44(in_stack_fffffffffffff49c,
                                                       in_stack_fffffffffffff498),
                                       (char *)in_stack_fffffffffffff490);
                if (local_6dc == -1) {
                  local_6e8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                        ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         (in_RDI[9] + 8),(long)local_35c);
                  local_6dc = local_35c;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8,
                             (allocator<char> *)in_stack_fffffffffffff4b0);
                  std::__cxx11::string::operator=((string *)local_6e8,local_708);
                  std::__cxx11::string::~string(local_708);
                  std::allocator<char>::~allocator(&local_709);
                  local_35c = local_35c + 1;
                }
                local_718 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_6dc);
                iVar7 = local_6dc;
                local_718->consumer = local_360;
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_588->bottoms,(long)local_5d8);
                *pvVar8 = iVar7;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff4a0,
                         CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
              for (local_71c = 0; local_71c < local_570; local_71c = local_71c + 1) {
                local_728 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_35c);
                iVar7 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_828);
                if (iVar7 != 1) {
                  fprintf(_stderr,"parse blob_name failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  goto LAB_001f3e63;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8,
                           (allocator<char> *)in_stack_fffffffffffff4b0);
                std::__cxx11::string::operator=((string *)local_728,local_848);
                std::__cxx11::string::~string(local_848);
                std::allocator<char>::~allocator(&local_849);
                iVar7 = local_35c;
                local_728->producer = local_360;
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_588->tops,(long)local_71c);
                *pvVar8 = iVar7;
                local_35c = local_35c + 1;
              }
              local_850 = ParamDict::load_param(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0)
              ;
              uVar6 = local_360;
              __stream = _stderr;
              if (local_850 == 0) {
                if ((local_588->support_int8_storage & 1U) != 0) {
                  *(undefined1 *)((long)in_RDI + 0x27) = 0;
                }
                local_320 = &local_8e0;
                local_8e0.data = (void *)0x0;
                local_8e0.refcount = (int *)0x0;
                local_8e0.elemsize = 0;
                local_8e0.elempack = 0;
                local_8e0.allocator = (Allocator *)0x0;
                local_8e0.dims = 0;
                local_8e0.w = 0;
                local_8e0.h = 0;
                local_8e0.d = 0;
                local_8e0.c = 0;
                local_8e0.cstep = 0;
                ParamDict::get(&local_898,&local_358,0x1e,&local_8e0);
                local_278 = &local_8e0;
                local_190 = local_278;
                if (local_8e0.refcount != (int *)0x0) {
                  local_194 = 0xffffffff;
                  LOCK();
                  local_198 = *local_8e0.refcount;
                  *local_8e0.refcount = *local_8e0.refcount + -1;
                  UNLOCK();
                  if (local_198 == 1) {
                    if (local_8e0.allocator == (Allocator *)0x0) {
                      local_68 = local_8e0.data;
                      if (local_8e0.data != (void *)0x0) {
                        free(local_8e0.data);
                      }
                    }
                    else {
                      (*(local_8e0.allocator)->_vptr_Allocator[3])
                                (local_8e0.allocator,local_8e0.data);
                    }
                  }
                }
                local_8e0.data = (void *)0x0;
                local_8e0.elemsize = 0;
                local_8e0.elempack = 0;
                local_8e0.dims = 0;
                local_8e0.w = 0;
                local_8e0.h = 0;
                local_8e0.d = 0;
                local_8e0.c = 0;
                local_8e0.cstep = 0;
                local_8e0.refcount = (int *)0x0;
                local_138 = &local_898;
                if ((int *)local_898.data != (int *)0x0) {
                  local_18 = local_138;
                }
                if ((int *)local_898.data != (int *)0x0 && local_898.cstep * (long)local_898.c != 0)
                {
                  local_130 = &local_898;
                  local_8e8 = (int *)local_898.data;
                  for (local_8ec = 0; local_8ec < local_570; local_8ec = local_8ec + 1) {
                    lVar1 = in_RDI[9];
                    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&local_588->tops,(long)local_8ec);
                    pvVar10 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                        ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         (lVar1 + 8),(long)*pvVar8);
                    local_8fc = *local_8e8;
                    local_8f8 = pvVar10;
                    if (local_8fc == 1) {
                      local_104 = local_8e8[1];
                      local_100 = &local_948;
                      local_110 = 0;
                      local_118 = 4;
                      local_11c = 1;
                      local_128 = 0;
                      local_948 = (NetPrivate *)0x0;
                      local_940 = (int *)0x0;
                      local_938 = 4;
                      local_930 = 1;
                      local_928 = (long *)0x0;
                      local_920 = 1;
                      local_91c = local_104;
                      local_918 = 1;
                      local_914 = 1;
                      local_910 = 1;
                      local_908 = (long)local_104;
                      pMVar11 = &pvVar10->shape;
                      local_290 = &local_948;
                      local_288 = pMVar11;
                      if (pMVar11 != (Mat *)local_290) {
                        local_180 = pMVar11;
                        if ((pvVar10->shape).refcount != (int *)0x0) {
                          piVar2 = (pvVar10->shape).refcount;
                          local_184 = 0xffffffff;
                          LOCK();
                          local_188 = *piVar2;
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (local_188 == 1) {
                            if ((pvVar10->shape).allocator == (Allocator *)0x0) {
                              local_70 = pMVar11->data;
                              if (local_70 != (void *)0x0) {
                                free(local_70);
                              }
                            }
                            else {
                              pAVar3 = (pvVar10->shape).allocator;
                              (*pAVar3->_vptr_Allocator[3])(pAVar3,pMVar11->data);
                            }
                          }
                        }
                        pMVar11->data = (void *)0x0;
                        (pvVar10->shape).elemsize = 0;
                        (pvVar10->shape).elempack = 0;
                        (pvVar10->shape).dims = 0;
                        (pvVar10->shape).w = 0;
                        (pvVar10->shape).h = 0;
                        (pvVar10->shape).d = 0;
                        (pvVar10->shape).c = 0;
                        (pvVar10->shape).cstep = 0;
                        (pvVar10->shape).refcount = (int *)0x0;
                        pMVar11->data = *local_290;
                        (pvVar10->shape).refcount = (int *)local_290[1];
                        (pvVar10->shape).elemsize = (size_t)local_290[2];
                        (pvVar10->shape).elempack = *(int *)(local_290 + 3);
                        (pvVar10->shape).allocator = (Allocator *)local_290[4];
                        (pvVar10->shape).dims = *(int *)(local_290 + 5);
                        (pvVar10->shape).w = *(int *)((long)local_290 + 0x2c);
                        (pvVar10->shape).h = *(int *)(local_290 + 6);
                        (pvVar10->shape).d = *(int *)((long)local_290 + 0x34);
                        (pvVar10->shape).c = *(int *)(local_290 + 7);
                        (pvVar10->shape).cstep = (size_t)local_290[8];
                      }
                      local_268 = &local_948;
                      local_280 = pMVar11;
                      local_1b0 = local_268;
                      if (local_940 != (int *)0x0) {
                        local_1b4 = 0xffffffff;
                        LOCK();
                        local_1b8 = *local_940;
                        *local_940 = *local_940 + -1;
                        UNLOCK();
                        if (local_1b8 == 1) {
                          if (local_928 == (long *)0x0) {
                            local_58 = local_948;
                            if (local_948 != (NetPrivate *)0x0) {
                              free(local_948);
                            }
                          }
                          else {
                            (**(code **)(*local_928 + 0x18))(local_928,local_948);
                          }
                        }
                      }
                      local_948 = (NetPrivate *)0x0;
                      local_938 = 0;
                      local_930 = 0;
                      local_920 = 0;
                      local_91c = 0;
                      local_918 = 0;
                      local_914 = 0;
                      local_910 = 0;
                      local_908 = 0;
                      local_940 = (int *)0x0;
                    }
                    pvVar10 = local_8f8;
                    if (local_8fc == 2) {
                      local_d4 = local_8e8[1];
                      local_d8 = local_8e8[2];
                      local_d0 = local_990;
                      local_e0 = 0;
                      local_e8 = 4;
                      local_ec = 1;
                      local_f8 = 0;
                      local_990 = (undefined1  [8])0x0;
                      local_988 = (int *)0x0;
                      local_980 = (Allocator *)0x4;
                      local_978 = 1;
                      local_970 = (long *)0x0;
                      local_968._0_1_ = true;
                      local_968._1_1_ = false;
                      local_968._2_1_ = false;
                      local_968._3_1_ = false;
                      local_964 = local_d4;
                      local_960 = local_d8;
                      local_95c._0_1_ = true;
                      local_95c._1_1_ = false;
                      local_95c._2_1_ = false;
                      local_95c._3_1_ = false;
                      local_958 = 1;
                      local_950 = (long)local_d4 * (long)local_d8;
                      pMVar11 = &local_8f8->shape;
                      local_2b0 = (undefined8 *)local_990;
                      local_2a8 = pMVar11;
                      if (pMVar11 != (Mat *)local_2b0) {
                        local_170 = pMVar11;
                        if ((local_8f8->shape).refcount != (int *)0x0) {
                          piVar2 = (local_8f8->shape).refcount;
                          local_174 = 0xffffffff;
                          LOCK();
                          local_178 = *piVar2;
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (local_178 == 1) {
                            if ((local_8f8->shape).allocator == (Allocator *)0x0) {
                              local_78 = pMVar11->data;
                              if (local_78 != (void *)0x0) {
                                free(local_78);
                              }
                            }
                            else {
                              pAVar3 = (local_8f8->shape).allocator;
                              (*pAVar3->_vptr_Allocator[3])(pAVar3,pMVar11->data);
                            }
                          }
                        }
                        pMVar11->data = (void *)0x0;
                        (pvVar10->shape).elemsize = 0;
                        (pvVar10->shape).elempack = 0;
                        (pvVar10->shape).dims = 0;
                        (pvVar10->shape).w = 0;
                        (pvVar10->shape).h = 0;
                        (pvVar10->shape).d = 0;
                        (pvVar10->shape).c = 0;
                        (pvVar10->shape).cstep = 0;
                        (pvVar10->shape).refcount = (int *)0x0;
                        pMVar11->data = (void *)*local_2b0;
                        (pvVar10->shape).refcount = (int *)local_2b0[1];
                        (pvVar10->shape).elemsize = local_2b0[2];
                        (pvVar10->shape).elempack = *(int *)(local_2b0 + 3);
                        (pvVar10->shape).allocator = (Allocator *)local_2b0[4];
                        (pvVar10->shape).dims = *(int *)(local_2b0 + 5);
                        (pvVar10->shape).w = *(int *)((long)local_2b0 + 0x2c);
                        (pvVar10->shape).h = *(int *)(local_2b0 + 6);
                        (pvVar10->shape).d = *(int *)((long)local_2b0 + 0x34);
                        (pvVar10->shape).c = *(int *)(local_2b0 + 7);
                        (pvVar10->shape).cstep = local_2b0[8];
                      }
                      in_stack_fffffffffffff510 = (Net *)local_990;
                      local_2a0 = pMVar11;
                      local_258 = in_stack_fffffffffffff510;
                      local_1d0 = in_stack_fffffffffffff510;
                      if (local_988 != (int *)0x0) {
                        local_1d4 = 0xffffffff;
                        LOCK();
                        local_1d8 = *local_988;
                        *local_988 = *local_988 + -1;
                        UNLOCK();
                        if (local_1d8 == 1) {
                          if (local_970 == (long *)0x0) {
                            local_48 = (_func_int **)local_990;
                            if (local_990 != (undefined1  [8])0x0) {
                              free((void *)local_990);
                            }
                          }
                          else {
                            (**(code **)(*local_970 + 0x18))(local_970,local_990);
                          }
                        }
                      }
                      in_stack_fffffffffffff510->_vptr_Net = (_func_int **)0x0;
                      (in_stack_fffffffffffff510->opt).blob_allocator = (Allocator *)0x0;
                      *(undefined4 *)&(in_stack_fffffffffffff510->opt).workspace_allocator = 0;
                      (in_stack_fffffffffffff510->opt).use_bf16_storage = false;
                      (in_stack_fffffffffffff510->opt).use_fp16_packed = false;
                      (in_stack_fffffffffffff510->opt).use_fp16_storage = false;
                      (in_stack_fffffffffffff510->opt).use_fp16_arithmetic = false;
                      (in_stack_fffffffffffff510->opt).use_int8_packed = false;
                      (in_stack_fffffffffffff510->opt).use_int8_storage = false;
                      (in_stack_fffffffffffff510->opt).use_int8_arithmetic = false;
                      (in_stack_fffffffffffff510->opt).use_packing_layout = false;
                      (in_stack_fffffffffffff510->opt).use_shader_pack8 = false;
                      (in_stack_fffffffffffff510->opt).use_subgroup_basic = false;
                      (in_stack_fffffffffffff510->opt).use_subgroup_vote = false;
                      (in_stack_fffffffffffff510->opt).use_subgroup_ballot = false;
                      (in_stack_fffffffffffff510->opt).use_subgroup_shuffle = false;
                      (in_stack_fffffffffffff510->opt).use_image_storage = false;
                      (in_stack_fffffffffffff510->opt).use_tensor_storage = false;
                      (in_stack_fffffffffffff510->opt).use_reserved_0 = false;
                      (in_stack_fffffffffffff510->opt).flush_denormals = 0;
                      (in_stack_fffffffffffff510->opt).use_winograd43_convolution = false;
                      (in_stack_fffffffffffff510->opt).use_winograd63_convolution = false;
                      (in_stack_fffffffffffff510->opt).use_reserved_6 = false;
                      (in_stack_fffffffffffff510->opt).use_reserved_7 = false;
                      (in_stack_fffffffffffff510->opt).use_reserved_8 = false;
                      (in_stack_fffffffffffff510->opt).use_reserved_9 = false;
                      (in_stack_fffffffffffff510->opt).use_reserved_10 = false;
                      (in_stack_fffffffffffff510->opt).use_reserved_11 = false;
                      (in_stack_fffffffffffff510->opt).lightmode = false;
                      *(undefined3 *)&(in_stack_fffffffffffff510->opt).field_0x1 = 0;
                      (in_stack_fffffffffffff510->opt).num_threads = 0;
                    }
                    pvVar10 = local_8f8;
                    if (local_8fc == 3) {
                      local_9c = local_8e8[1];
                      local_a0 = local_8e8[2];
                      local_a4 = local_8e8[3];
                      local_98 = &local_9d8;
                      local_b0 = 0;
                      local_b8 = 4;
                      local_bc = 1;
                      local_c8 = 0;
                      local_9d8._vptr_ParamDict = (_func_int **)0x0;
                      local_9d8.d = (ParamDictPrivate *)0x0;
                      local_9c8 = 4;
                      local_9c0 = 1;
                      local_9b8 = (long *)0x0;
                      local_9b0 = 3;
                      local_9ac = local_9c;
                      local_9a8 = local_a0;
                      local_9a4 = 1;
                      local_9a0 = local_a4;
                      local_8 = (long)local_9c * (long)local_a0 * 4;
                      local_c = 0x10;
                      uVar12 = local_8 + 0xfU & 0xfffffffffffffff0;
                      local_998 = uVar12 / 4;
                      pMVar11 = &local_8f8->shape;
                      local_2d0 = &local_9d8;
                      local_2c8 = pMVar11;
                      if (pMVar11 != (Mat *)local_2d0) {
                        local_160 = pMVar11;
                        if ((local_8f8->shape).refcount != (int *)0x0) {
                          piVar2 = (local_8f8->shape).refcount;
                          local_164 = 0xffffffff;
                          LOCK();
                          local_168 = *piVar2;
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (local_168 == 1) {
                            if ((local_8f8->shape).allocator == (Allocator *)0x0) {
                              local_80 = pMVar11->data;
                              if (local_80 != (void *)0x0) {
                                free(local_80);
                              }
                            }
                            else {
                              pAVar3 = (local_8f8->shape).allocator;
                              (*pAVar3->_vptr_Allocator[3])(pAVar3,pMVar11->data,uVar12 % 4);
                            }
                          }
                        }
                        pMVar11->data = (void *)0x0;
                        (pvVar10->shape).elemsize = 0;
                        (pvVar10->shape).elempack = 0;
                        (pvVar10->shape).dims = 0;
                        (pvVar10->shape).w = 0;
                        (pvVar10->shape).h = 0;
                        (pvVar10->shape).d = 0;
                        (pvVar10->shape).c = 0;
                        (pvVar10->shape).cstep = 0;
                        (pvVar10->shape).refcount = (int *)0x0;
                        pMVar11->data = local_2d0->_vptr_ParamDict;
                        (pvVar10->shape).refcount = (int *)local_2d0->d;
                        (pvVar10->shape).elemsize = (size_t)local_2d0[1]._vptr_ParamDict;
                        (pvVar10->shape).elempack = *(int *)&local_2d0[1].d;
                        (pvVar10->shape).allocator = (Allocator *)local_2d0[2]._vptr_ParamDict;
                        (pvVar10->shape).dims = *(int *)&local_2d0[2].d;
                        (pvVar10->shape).w = *(int *)((long)&local_2d0[2].d + 4);
                        (pvVar10->shape).h = *(int *)&local_2d0[3]._vptr_ParamDict;
                        (pvVar10->shape).d = *(int *)((long)&local_2d0[3]._vptr_ParamDict + 4);
                        (pvVar10->shape).c = *(int *)&local_2d0[3].d;
                        (pvVar10->shape).cstep = (size_t)local_2d0[4]._vptr_ParamDict;
                      }
                      in_stack_fffffffffffff4e8 = &local_9d8;
                      local_2c0 = pMVar11;
                      local_248 = in_stack_fffffffffffff4e8;
                      local_1f0 = in_stack_fffffffffffff4e8;
                      if (local_9d8.d != (ParamDictPrivate *)0x0) {
                        local_1f4 = 0xffffffff;
                        LOCK();
                        local_1f8 = (local_9d8.d)->params[0].type;
                        (local_9d8.d)->params[0].type = (local_9d8.d)->params[0].type + -1;
                        UNLOCK();
                        if (local_1f8 == 1) {
                          if (local_9b8 == (long *)0x0) {
                            local_38 = local_9d8._vptr_ParamDict;
                            if (local_9d8._vptr_ParamDict != (_func_int **)0x0) {
                              free(local_9d8._vptr_ParamDict);
                            }
                          }
                          else {
                            (**(code **)(*local_9b8 + 0x18))(local_9b8,local_9d8._vptr_ParamDict);
                          }
                        }
                      }
                      in_stack_fffffffffffff4e8->_vptr_ParamDict = (_func_int **)0x0;
                      in_stack_fffffffffffff4e8[1]._vptr_ParamDict = (_func_int **)0x0;
                      *(undefined4 *)&in_stack_fffffffffffff4e8[1].d = 0;
                      *(undefined4 *)&in_stack_fffffffffffff4e8[2].d = 0;
                      *(undefined4 *)((long)&in_stack_fffffffffffff4e8[2].d + 4) = 0;
                      *(undefined4 *)&in_stack_fffffffffffff4e8[3]._vptr_ParamDict = 0;
                      *(undefined4 *)((long)&in_stack_fffffffffffff4e8[3]._vptr_ParamDict + 4) = 0;
                      *(undefined4 *)&in_stack_fffffffffffff4e8[3].d = 0;
                      in_stack_fffffffffffff4e8[4]._vptr_ParamDict = (_func_int **)0x0;
                      in_stack_fffffffffffff4e8->d = (ParamDictPrivate *)0x0;
                    }
                    local_8e8 = local_8e8 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffff4a0,
                           CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
                for (local_9dc = 0; local_9dc < local_56c; local_9dc = local_9dc + 1) {
                  lVar1 = in_RDI[9];
                  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_588->bottoms,(long)local_9dc);
                  pvVar10 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (lVar1 + 8),(long)*pvVar8);
                  in_stack_fffffffffffff4d0 = (NetPrivate *)&pvVar10->shape;
                  pNVar13 = (NetPrivate *)
                            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                      (&local_588->bottom_shapes,(long)local_9dc);
                  local_2f0 = in_stack_fffffffffffff4d0;
                  local_2e8 = pNVar13;
                  if (pNVar13 != in_stack_fffffffffffff4d0) {
                    if ((in_stack_fffffffffffff4d0->blobs).
                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      pBVar4 = (in_stack_fffffffffffff4d0->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_2f4 = 1;
                      LOCK();
                      local_2f8 = *(int *)&pBVar4->name;
                      *(int *)&pBVar4->name = *(int *)&pBVar4->name + 1;
                      UNLOCK();
                    }
                    in_stack_fffffffffffff4c0 = pNVar13;
                    local_150 = pNVar13;
                    if ((pNVar13->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      pBVar4 = (pNVar13->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_154 = 0xffffffff;
                      LOCK();
                      local_158 = *(int *)&pBVar4->name;
                      *(int *)&pBVar4->name = *(int *)&pBVar4->name + -1;
                      UNLOCK();
                      if (local_158 == 1) {
                        if ((Allocator *)
                            (pNVar13->layers).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start == (Allocator *)0x0) {
                          local_88 = pNVar13->opt;
                          if (local_88 != (Option *)0x0) {
                            free(local_88);
                          }
                        }
                        else {
                          pAVar3 = (Allocator *)
                                   (pNVar13->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          (*pAVar3->_vptr_Allocator[3])(pAVar3,pNVar13->opt);
                        }
                      }
                    }
                    in_stack_fffffffffffff4c0->opt = (Option *)0x0;
                    (in_stack_fffffffffffff4c0->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    *(int *)&(in_stack_fffffffffffff4c0->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage = 0;
                    *(int *)&(in_stack_fffffffffffff4c0->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish = 0;
                    *(int *)((long)&(in_stack_fffffffffffff4c0->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
                    *(int *)&(in_stack_fffffffffffff4c0->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
                    *(int *)((long)&(in_stack_fffffffffffff4c0->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
                    *(int *)&(in_stack_fffffffffffff4c0->input_blob_indexes).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start = 0;
                    (in_stack_fffffffffffff4c0->input_blob_indexes).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish = (pointer)0x0;
                    (in_stack_fffffffffffff4c0->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    pNVar13->opt = local_2f0->opt;
                    (pNVar13->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (local_2f0->blobs).
                         super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    (pNVar13->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (local_2f0->blobs).
                         super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    *(int *)&(pNVar13->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage =
                         *(int *)&(local_2f0->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                    (pNVar13->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)(local_2f0->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                    *(int *)&(pNVar13->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish =
                         *(int *)&(local_2f0->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish;
                    *(int *)((long)&(pNVar13->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4) =
                         *(int *)((long)&(local_2f0->layers).
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 4);
                    *(int *)&(pNVar13->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage =
                         *(int *)&(local_2f0->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                    *(int *)((long)&(pNVar13->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                         *(int *)((long)&(local_2f0->layers).
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                    *(int *)&(pNVar13->input_blob_indexes).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start =
                         *(int *)&(local_2f0->input_blob_indexes).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                    (pNVar13->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (local_2f0->input_blob_indexes).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                  }
                  local_2e0 = pNVar13;
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffff4a0,
                           CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
                for (local_9e0 = 0; local_9e0 < local_570; local_9e0 = local_9e0 + 1) {
                  lVar1 = in_RDI[9];
                  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_588->tops,(long)local_9e0);
                  pvVar10 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (lVar1 + 8),(long)*pvVar8);
                  in_stack_fffffffffffff4b0 = (NetPrivate *)&pvVar10->shape;
                  in_stack_fffffffffffff4b8 =
                       (NetPrivate *)
                       std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (&local_588->top_shapes,(long)local_9e0);
                  local_310 = in_stack_fffffffffffff4b0;
                  local_308 = in_stack_fffffffffffff4b8;
                  if (in_stack_fffffffffffff4b8 != in_stack_fffffffffffff4b0) {
                    if ((in_stack_fffffffffffff4b0->blobs).
                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      pBVar4 = (in_stack_fffffffffffff4b0->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_314 = 1;
                      LOCK();
                      local_318 = *(int *)&pBVar4->name;
                      *(int *)&pBVar4->name = *(int *)&pBVar4->name + 1;
                      UNLOCK();
                    }
                    pNVar13 = in_stack_fffffffffffff4b8;
                    local_140 = in_stack_fffffffffffff4b8;
                    if ((in_stack_fffffffffffff4b8->blobs).
                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      pBVar4 = (in_stack_fffffffffffff4b8->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_144 = 0xffffffff;
                      LOCK();
                      local_148 = *(int *)&pBVar4->name;
                      *(int *)&pBVar4->name = *(int *)&pBVar4->name + -1;
                      UNLOCK();
                      if (local_148 == 1) {
                        if ((Allocator *)
                            (in_stack_fffffffffffff4b8->layers).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start == (Allocator *)0x0) {
                          local_90 = in_stack_fffffffffffff4b8->opt;
                          if (local_90 != (Option *)0x0) {
                            free(local_90);
                          }
                        }
                        else {
                          pAVar3 = (Allocator *)
                                   (in_stack_fffffffffffff4b8->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          (*pAVar3->_vptr_Allocator[3])(pAVar3,in_stack_fffffffffffff4b8->opt);
                        }
                      }
                    }
                    in_stack_fffffffffffff4b8->opt = (Option *)0x0;
                    (in_stack_fffffffffffff4b8->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    *(int *)&(in_stack_fffffffffffff4b8->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage = 0;
                    *(int *)&(in_stack_fffffffffffff4b8->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish = 0;
                    *(int *)((long)&(in_stack_fffffffffffff4b8->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
                    *(int *)&(in_stack_fffffffffffff4b8->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
                    *(int *)((long)&(in_stack_fffffffffffff4b8->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
                    *(int *)&(in_stack_fffffffffffff4b8->input_blob_indexes).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start = 0;
                    (in_stack_fffffffffffff4b8->input_blob_indexes).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish = (pointer)0x0;
                    (in_stack_fffffffffffff4b8->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    pNVar13->opt = local_310->opt;
                    (pNVar13->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (local_310->blobs).
                         super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    (pNVar13->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (local_310->blobs).
                         super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    *(int *)&(pNVar13->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage =
                         *(int *)&(local_310->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                    (pNVar13->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)(local_310->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                    *(int *)&(pNVar13->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish =
                         *(int *)&(local_310->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish;
                    *(int *)((long)&(pNVar13->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4) =
                         *(int *)((long)&(local_310->layers).
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 4);
                    *(int *)&(pNVar13->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage =
                         *(int *)&(local_310->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                    *(int *)((long)&(pNVar13->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                         *(int *)((long)&(local_310->layers).
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                    *(int *)&(pNVar13->input_blob_indexes).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start =
                         *(int *)&(local_310->input_blob_indexes).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                    (pNVar13->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (local_310->input_blob_indexes).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    in_stack_fffffffffffff4a0 = in_stack_fffffffffffff4b8;
                    in_stack_fffffffffffff4b8 = pNVar13;
                  }
                  local_300 = in_stack_fffffffffffff4b8;
                }
                in_stack_fffffffffffff49c = (*local_588->_vptr_Layer[2])(local_588,&local_358);
                pLVar5 = local_588;
                if (in_stack_fffffffffffff49c == 0) {
                  ppLVar14 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                       ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                        (in_RDI[9] + 0x20),(long)(int)local_360);
                  *ppLVar14 = pLVar5;
                  local_580 = 0;
                }
                else {
                  in_stack_fffffffffffff490 = _stderr;
                  in_stack_fffffffffffff498 = local_360;
                  uVar9 = std::__cxx11::string::c_str();
                  fprintf(in_stack_fffffffffffff490,"layer load_param %d %s failed",
                          (ulong)in_stack_fffffffffffff498,uVar9);
                  fprintf(_stderr,"\n");
                  local_580 = 0xe;
                }
                in_stack_fffffffffffff480 = &local_898;
                local_238 = in_stack_fffffffffffff480;
                local_210 = in_stack_fffffffffffff480;
                if (local_898.refcount != (int *)0x0) {
                  local_214 = 0xffffffff;
                  LOCK();
                  local_218 = *local_898.refcount;
                  *local_898.refcount = *local_898.refcount + -1;
                  UNLOCK();
                  if (local_218 == 1) {
                    if (local_898.allocator == (Allocator *)0x0) {
                      if ((int *)local_898.data != (int *)0x0) {
                        free(local_898.data);
                      }
                    }
                    else {
                      (*(local_898.allocator)->_vptr_Allocator[3])
                                (local_898.allocator,local_898.data);
                    }
                  }
                }
                in_stack_fffffffffffff480->data = (void *)0x0;
                in_stack_fffffffffffff480->elemsize = 0;
                in_stack_fffffffffffff480->elempack = 0;
                in_stack_fffffffffffff480->dims = 0;
                in_stack_fffffffffffff480->w = 0;
                in_stack_fffffffffffff480->h = 0;
                in_stack_fffffffffffff480->d = 0;
                in_stack_fffffffffffff480->c = 0;
                in_stack_fffffffffffff480->cstep = 0;
                in_stack_fffffffffffff480->refcount = (int *)0x0;
              }
              else {
                uVar9 = std::__cxx11::string::c_str();
                fprintf(__stream,"ParamDict load_param %d %s failed",(ulong)uVar6,uVar9);
                fprintf(_stderr,"\n");
              }
            }
            NetPrivate::update_input_output_indexes(in_stack_fffffffffffff4b0);
            NetPrivate::update_input_output_names(in_stack_fffffffffffff4d0);
            local_324 = 0;
LAB_001f3e63:
            local_580 = 1;
            ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff480);
          }
        }
        else {
          fprintf(_stderr,"parse blob_count failed");
          fprintf(_stderr,"\n");
          local_324 = -1;
        }
      }
      else {
        fprintf(_stderr,"parse layer_count failed");
        fprintf(_stderr,"\n");
        local_324 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate");
      fprintf(_stderr,"\n");
      local_324 = -1;
    }
  }
  else {
    fprintf(_stderr,"parse magic failed");
    fprintf(_stderr,"\n");
    local_324 = -1;
  }
  return local_324;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}